

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataManSerializer.cpp
# Opt level: O0

void __thiscall adios2::format::DataManSerializer::GetAttributes(DataManSerializer *this,IO *io)

{
  bool bVar1;
  int iVar2;
  DataType DVar3;
  DataType DVar4;
  DataType DVar5;
  undefined8 uVar6;
  IO *in_RSI;
  const_iterator it_14;
  AttrMap *attributes_14;
  const_iterator it_13;
  AttrMap *attributes_13;
  const_iterator it_12;
  AttrMap *attributes_12;
  const_iterator it_11;
  AttrMap *attributes_11;
  const_iterator it_10;
  AttrMap *attributes_10;
  const_iterator it_9;
  AttrMap *attributes_9;
  const_iterator it_8;
  AttrMap *attributes_8;
  const_iterator it_7;
  AttrMap *attributes_7;
  const_iterator it_6;
  AttrMap *attributes_6;
  const_iterator it_5;
  AttrMap *attributes_5;
  const_iterator it_4;
  AttrMap *attributes_4;
  const_iterator it_3;
  AttrMap *attributes_3;
  const_iterator it_2;
  AttrMap *attributes_2;
  const_iterator it_1;
  AttrMap *attributes_1;
  const_iterator it;
  AttrMap *attributes;
  DataType type;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *staticVar;
  iterator __end2;
  iterator __begin2;
  value_type *__range2;
  lock_guard<std::mutex> lStaticDataJson;
  ScopedTimer __var2117;
  undefined4 in_stack_ffffffffffffe1c8;
  undefined4 in_stack_ffffffffffffe1cc;
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *in_stack_ffffffffffffe1d0;
  string *in_stack_ffffffffffffe1d8;
  allocator *in_stack_ffffffffffffe1e0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_true>
  in_stack_ffffffffffffe258;
  const_reference in_stack_ffffffffffffe298;
  const_reference in_stack_ffffffffffffe2a0;
  const_reference in_stack_ffffffffffffe618;
  undefined7 in_stack_ffffffffffffe620;
  undefined1 in_stack_ffffffffffffe627;
  string *in_stack_ffffffffffffe628;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_true>
  in_stack_ffffffffffffe630;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe638;
  string *in_stack_ffffffffffffe640;
  undefined4 in_stack_ffffffffffffe648;
  DataType in_stack_ffffffffffffe64c;
  undefined1 local_1479 [40];
  allocator local_1451;
  string local_1450 [32];
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> local_1430 [2];
  string local_1400 [39];
  allocator local_13d9;
  string local_13d8 [39];
  allocator local_13b1;
  string local_13b0 [48];
  string local_1380 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_true>
  local_1360;
  string local_1358 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_true>
  local_1338;
  AttrMap *local_1330;
  allocator local_1321;
  string local_1320 [39];
  allocator local_12f9;
  string local_12f8 [32];
  vector<std::complex<float>,_std::allocator<std::complex<float>_>_> local_12d8 [2];
  string local_12a8 [39];
  allocator local_1281;
  string local_1280 [39];
  allocator local_1259;
  string local_1258 [40];
  string local_1230 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_true>
  local_1210;
  string local_1208 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_true>
  local_11e8;
  AttrMap *local_11e0;
  allocator local_11d1;
  string local_11d0 [39];
  allocator local_11a9;
  string local_11a8 [32];
  vector<long_double,_std::allocator<long_double>_> local_1188 [2];
  string local_1158 [39];
  allocator local_1131;
  string local_1130 [39];
  allocator local_1109;
  string local_1108 [48];
  string local_10d8 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_true>
  local_10b8;
  string local_10b0 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_true>
  local_1090;
  AttrMap *local_1088;
  allocator local_1079;
  string local_1078 [39];
  allocator local_1051;
  string local_1050 [32];
  vector<double,_std::allocator<double>_> local_1030 [2];
  string local_1000 [39];
  allocator local_fd9;
  string local_fd8 [39];
  allocator local_fb1;
  string local_fb0 [32];
  double local_f90;
  string local_f88 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_true>
  local_f68;
  string local_f60 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_true>
  local_f40;
  AttrMap *local_f38;
  allocator local_f29;
  string local_f28 [39];
  allocator local_f01;
  string local_f00 [32];
  vector<float,_std::allocator<float>_> local_ee0 [2];
  string local_eb0 [39];
  allocator local_e89;
  string local_e88 [39];
  allocator local_e61;
  string local_e60 [36];
  float local_e3c;
  string local_e38 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_true>
  local_e18;
  string local_e10 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_true>
  local_df0;
  AttrMap *local_de8;
  allocator local_dd9;
  string local_dd8 [39];
  allocator local_db1;
  string local_db0 [32];
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_d90 [2];
  string local_d60 [39];
  allocator local_d39;
  string local_d38 [39];
  allocator local_d11;
  string local_d10 [32];
  unsigned_long local_cf0;
  string local_ce8 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_true>
  local_cc8;
  string local_cc0 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_true>
  local_ca0;
  AttrMap *local_c98;
  allocator local_c89;
  string local_c88 [39];
  allocator local_c61;
  string local_c60 [32];
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_c40 [2];
  string local_c10 [39];
  allocator local_be9;
  string local_be8 [39];
  allocator local_bc1;
  string local_bc0 [36];
  uint local_b9c;
  string local_b98 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_true>
  local_b78;
  string local_b70 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_true>
  local_b50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b48;
  allocator local_b39;
  string local_b38 [39];
  allocator local_b11;
  string local_b10 [32];
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_af0 [2];
  string local_ac0 [39];
  allocator local_a99;
  string local_a98 [39];
  allocator local_a71;
  string local_a70 [38];
  unsigned_short local_a4a;
  string local_a48 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_true>
  local_a28;
  string local_a20 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_true>
  local_a00;
  AttrMap *local_9f8;
  allocator local_9e9;
  string local_9e8 [39];
  allocator local_9c1;
  string local_9c0 [32];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_9a0 [2];
  string local_970 [39];
  allocator local_949;
  string local_948 [39];
  allocator local_921;
  string local_920 [39];
  uchar local_8f9;
  string local_8f8 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_true>
  local_8d8;
  string local_8d0 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_true>
  local_8b0;
  AttrMap *local_8a8;
  allocator local_899;
  string local_898 [39];
  allocator local_871;
  string local_870 [32];
  vector<long,_std::allocator<long>_> local_850 [2];
  string local_820 [39];
  allocator local_7f9;
  string local_7f8 [39];
  allocator local_7d1;
  string local_7d0 [32];
  long local_7b0;
  string local_7a8 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_true>
  local_788;
  string local_780 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_true>
  local_760;
  AttrMap *local_758;
  allocator local_749;
  string local_748 [39];
  allocator local_721;
  string local_720 [32];
  vector<int,_std::allocator<int>_> local_700 [2];
  string local_6d0 [39];
  allocator local_6a9;
  string local_6a8 [39];
  allocator local_681;
  string local_680 [36];
  int local_65c;
  string local_658 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_true>
  local_638;
  string local_630 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_true>
  local_610;
  AttrMap *local_608;
  allocator local_5f9;
  string local_5f8 [39];
  allocator local_5d1;
  string local_5d0 [32];
  vector<short,_std::allocator<short>_> local_5b0 [2];
  string local_580 [39];
  allocator local_559;
  string local_558 [39];
  allocator local_531;
  string local_530 [38];
  short local_50a;
  string local_508 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_true>
  local_4e8;
  string local_4e0 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_true>
  local_4c0;
  AttrMap *local_4b8;
  allocator local_4a9;
  string local_4a8 [39];
  allocator local_481;
  string local_480 [32];
  vector<signed_char,_std::allocator<signed_char>_> local_460 [2];
  string local_430 [39];
  allocator local_409;
  string local_408 [39];
  allocator local_3e1;
  string local_3e0 [39];
  char local_3b9;
  string local_3b8 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_true>
  local_398;
  string local_390 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_true>
  local_370;
  AttrMap *local_368;
  allocator local_359;
  string local_358 [39];
  allocator local_331;
  string local_330 [32];
  vector<char,_std::allocator<char>_> local_310 [2];
  string local_2e0 [39];
  allocator local_2b9;
  string local_2b8 [39];
  allocator local_291;
  string local_290 [39];
  char local_269;
  string local_268 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_true>
  local_248;
  string local_240 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_true>
  local_220;
  AttrMap *local_218;
  allocator local_209;
  string local_208 [39];
  allocator local_1e1;
  string local_1e0 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c0 [2];
  string local_190 [39];
  allocator local_169;
  string local_168 [39];
  allocator local_141;
  string local_140 [32];
  string local_120 [32];
  string local_100 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_true>
  local_e0;
  string local_d8 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_true>
  local_b8;
  AttrMap *local_b0;
  string local_a8 [36];
  DataType local_84;
  reference local_80;
  reference local_38;
  IO *local_10;
  
  local_10 = in_RSI;
  if ((GetAttributes(adios2::core::IO&)::__var117 == '\0') &&
     (iVar2 = __cxa_guard_acquire(&GetAttributes(adios2::core::IO&)::__var117), iVar2 != 0)) {
    uVar6 = ps_make_timer_name_("/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/toolkit/format/dataman/DataManSerializer.cpp"
                                ,"void adios2::format::DataManSerializer::GetAttributes(core::IO &)"
                                ,0x75);
    GetAttributes::__var117 = (void *)ps_timer_create_(uVar6);
    __cxa_guard_release(&GetAttributes(adios2::core::IO&)::__var117);
  }
  external::perfstubs_profiler::ScopedTimer::ScopedTimer
            ((ScopedTimer *)in_stack_ffffffffffffe1d0,
             (void *)CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8));
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_ffffffffffffe1d0,
             (mutex_type *)CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8));
  local_38 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
             ::operator[]<char_const>(in_stack_ffffffffffffe2a0,(char *)in_stack_ffffffffffffe298);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::begin((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           *)in_stack_ffffffffffffe1d8);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::end((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
         *)in_stack_ffffffffffffe1d8);
  while (bVar1 = nlohmann::detail::
                 iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::
                 operator!=<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                           (in_stack_ffffffffffffe1d0,
                            (iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8)), bVar1
        ) {
    local_80 = nlohmann::detail::
               iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            *)in_stack_ffffffffffffe258._M_cur);
    nlohmann::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::operator[]<char_const>(in_stack_ffffffffffffe2a0,(char *)in_stack_ffffffffffffe298);
    nlohmann::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::get<std::__cxx11::string,std::__cxx11::string>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)in_stack_ffffffffffffe1d8);
    DVar3 = helper::GetDataTypeFromString(in_stack_ffffffffffffe1d8);
    std::__cxx11::string::~string(local_a8);
    local_84 = DVar3;
    if (DVar3 != None) {
      DVar4 = helper::GetDataType<std::__cxx11::string>();
      DVar5 = local_84;
      if (DVar3 == DVar4) {
        local_b0 = core::IO::GetAttributes_abi_cxx11_(local_10);
        nlohmann::
        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
        ::operator[]<char_const>(in_stack_ffffffffffffe2a0,(char *)in_stack_ffffffffffffe298);
        nlohmann::
        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
        ::get<std::__cxx11::string,std::__cxx11::string>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)in_stack_ffffffffffffe1d8);
        local_b8._M_cur =
             (__node_type *)
             std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>_>
             ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>_>
                     *)CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8),
                    (key_type *)0xdcaa28);
        std::__cxx11::string::~string(local_d8);
        local_e0._M_cur =
             (__node_type *)
             std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>_>
             ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>_>
                    *)CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8));
        bVar1 = std::__detail::operator==(&local_b8,&local_e0);
        if (bVar1) {
          nlohmann::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
          ::operator[]<char_const>(in_stack_ffffffffffffe2a0,(char *)in_stack_ffffffffffffe298);
          bVar1 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::get<bool,bool>((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                    *)in_stack_ffffffffffffe1d0);
          if (bVar1) {
            nlohmann::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ::operator[]<char_const>(in_stack_ffffffffffffe2a0,(char *)in_stack_ffffffffffffe298);
            nlohmann::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ::get<std::__cxx11::string,std::__cxx11::string>
                      ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)in_stack_ffffffffffffe1d8);
            nlohmann::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ::operator[]<char_const>(in_stack_ffffffffffffe2a0,(char *)in_stack_ffffffffffffe298);
            nlohmann::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ::get<std::__cxx11::string,std::__cxx11::string>
                      ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)in_stack_ffffffffffffe1d8);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_140,"",&local_141);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_168,"/",&local_169);
            core::IO::DefineAttribute<std::__cxx11::string>
                      ((IO *)CONCAT44(in_stack_ffffffffffffe64c,in_stack_ffffffffffffe648),
                       in_stack_ffffffffffffe640,in_stack_ffffffffffffe638,
                       (string *)in_stack_ffffffffffffe630._M_cur,in_stack_ffffffffffffe628,
                       (bool)in_stack_ffffffffffffe627);
            std::__cxx11::string::~string(local_168);
            std::allocator<char>::~allocator((allocator<char> *)&local_169);
            std::__cxx11::string::~string(local_140);
            std::allocator<char>::~allocator((allocator<char> *)&local_141);
            std::__cxx11::string::~string(local_120);
            std::__cxx11::string::~string(local_100);
          }
          else {
            nlohmann::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ::operator[]<char_const>(in_stack_ffffffffffffe2a0,(char *)in_stack_ffffffffffffe298);
            nlohmann::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ::get<std::__cxx11::string,std::__cxx11::string>
                      ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)in_stack_ffffffffffffe1d8);
            nlohmann::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ::operator[]<char_const>(in_stack_ffffffffffffe2a0,(char *)in_stack_ffffffffffffe298);
            nlohmann::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ::
            get<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                      ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)in_stack_ffffffffffffe1d8);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::data((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)0xdcad84);
            nlohmann::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ::operator[]<char_const>(in_stack_ffffffffffffe2a0,(char *)in_stack_ffffffffffffe298);
            nlohmann::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ::
            get<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                      ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)in_stack_ffffffffffffe1d8);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(local_1c0);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_1e0,"",&local_1e1);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_208,"/",&local_209);
            in_stack_ffffffffffffe1c8 = 0;
            core::IO::DefineAttribute<std::__cxx11::string>
                      ((IO *)CONCAT44(in_stack_ffffffffffffe64c,in_stack_ffffffffffffe648),
                       in_stack_ffffffffffffe640,in_stack_ffffffffffffe638,
                       (size_t)in_stack_ffffffffffffe630._M_cur,in_stack_ffffffffffffe628,
                       (string *)CONCAT17(in_stack_ffffffffffffe627,in_stack_ffffffffffffe620),
                       SUB81((ulong)in_stack_ffffffffffffe618 >> 0x38,0));
            std::__cxx11::string::~string(local_208);
            std::allocator<char>::~allocator((allocator<char> *)&local_209);
            std::__cxx11::string::~string(local_1e0);
            std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_ffffffffffffe1e0);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_ffffffffffffe1e0);
            std::__cxx11::string::~string(local_190);
          }
        }
      }
      else {
        DVar4 = helper::GetDataType<char>();
        DVar3 = local_84;
        if (DVar5 == DVar4) {
          local_218 = core::IO::GetAttributes_abi_cxx11_(local_10);
          nlohmann::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
          ::operator[]<char_const>(in_stack_ffffffffffffe2a0,(char *)in_stack_ffffffffffffe298);
          nlohmann::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
          ::get<std::__cxx11::string,std::__cxx11::string>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)in_stack_ffffffffffffe1d8);
          local_220._M_cur =
               (__node_type *)
               std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>_>
               ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>_>
                       *)CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8),
                      (key_type *)0xdcb048);
          std::__cxx11::string::~string(local_240);
          local_248._M_cur =
               (__node_type *)
               std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>_>
               ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>_>
                      *)CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8));
          bVar1 = std::__detail::operator==(&local_220,&local_248);
          if (bVar1) {
            nlohmann::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ::operator[]<char_const>(in_stack_ffffffffffffe2a0,(char *)in_stack_ffffffffffffe298);
            bVar1 = nlohmann::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    ::get<bool,bool>((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                      *)in_stack_ffffffffffffe1d0);
            if (bVar1) {
              nlohmann::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ::operator[]<char_const>(in_stack_ffffffffffffe2a0,(char *)in_stack_ffffffffffffe298);
              nlohmann::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ::get<std::__cxx11::string,std::__cxx11::string>
                        ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)in_stack_ffffffffffffe1d8);
              nlohmann::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ::operator[]<char_const>(in_stack_ffffffffffffe2a0,(char *)in_stack_ffffffffffffe298);
              local_269 = nlohmann::
                          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                          ::get<char,char>((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                            *)in_stack_ffffffffffffe1d0);
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_290,"",&local_291);
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_2b8,"/",&local_2b9);
              core::IO::DefineAttribute<char>
                        ((IO *)CONCAT44(in_stack_ffffffffffffe64c,in_stack_ffffffffffffe648),
                         in_stack_ffffffffffffe640,(char *)in_stack_ffffffffffffe638,
                         (string *)in_stack_ffffffffffffe630._M_cur,in_stack_ffffffffffffe628,
                         (bool)in_stack_ffffffffffffe627);
              std::__cxx11::string::~string(local_2b8);
              std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
              std::__cxx11::string::~string(local_290);
              std::allocator<char>::~allocator((allocator<char> *)&local_291);
              std::__cxx11::string::~string(local_268);
            }
            else {
              nlohmann::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ::operator[]<char_const>(in_stack_ffffffffffffe2a0,(char *)in_stack_ffffffffffffe298);
              nlohmann::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ::get<std::__cxx11::string,std::__cxx11::string>
                        ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)in_stack_ffffffffffffe1d8);
              nlohmann::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ::operator[]<char_const>(in_stack_ffffffffffffe2a0,(char *)in_stack_ffffffffffffe298);
              nlohmann::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ::get<std::vector<char,std::allocator<char>>,std::vector<char,std::allocator<char>>>
                        ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)in_stack_ffffffffffffe1d8);
              std::vector<char,_std::allocator<char>_>::data
                        ((vector<char,_std::allocator<char>_> *)0xdcb394);
              nlohmann::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ::operator[]<char_const>(in_stack_ffffffffffffe2a0,(char *)in_stack_ffffffffffffe298);
              nlohmann::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ::get<std::vector<char,std::allocator<char>>,std::vector<char,std::allocator<char>>>
                        ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)in_stack_ffffffffffffe1d8);
              std::vector<char,_std::allocator<char>_>::size(local_310);
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_330,"",&local_331);
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_358,"/",&local_359);
              in_stack_ffffffffffffe1c8 = 0;
              core::IO::DefineAttribute<char>
                        ((IO *)CONCAT44(in_stack_ffffffffffffe64c,in_stack_ffffffffffffe648),
                         in_stack_ffffffffffffe640,(char *)in_stack_ffffffffffffe638,
                         (size_t)in_stack_ffffffffffffe630._M_cur,in_stack_ffffffffffffe628,
                         (string *)CONCAT17(in_stack_ffffffffffffe627,in_stack_ffffffffffffe620),
                         SUB81((ulong)in_stack_ffffffffffffe618 >> 0x38,0));
              std::__cxx11::string::~string(local_358);
              std::allocator<char>::~allocator((allocator<char> *)&local_359);
              std::__cxx11::string::~string(local_330);
              std::allocator<char>::~allocator((allocator<char> *)&local_331);
              std::vector<char,_std::allocator<char>_>::~vector
                        ((vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffe1e0);
              std::vector<char,_std::allocator<char>_>::~vector
                        ((vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffe1e0);
              std::__cxx11::string::~string(local_2e0);
            }
          }
        }
        else {
          DVar4 = helper::GetDataType<signed_char>();
          DVar5 = local_84;
          if (DVar3 == DVar4) {
            local_368 = core::IO::GetAttributes_abi_cxx11_(local_10);
            nlohmann::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ::operator[]<char_const>(in_stack_ffffffffffffe2a0,(char *)in_stack_ffffffffffffe298);
            nlohmann::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ::get<std::__cxx11::string,std::__cxx11::string>
                      ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)in_stack_ffffffffffffe1d8);
            local_370._M_cur =
                 (__node_type *)
                 std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>_>
                 ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>_>
                         *)CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8),
                        (key_type *)0xdcb658);
            std::__cxx11::string::~string(local_390);
            local_398._M_cur =
                 (__node_type *)
                 std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>_>
                 ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>_>
                        *)CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8));
            bVar1 = std::__detail::operator==(&local_370,&local_398);
            if (bVar1) {
              nlohmann::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ::operator[]<char_const>(in_stack_ffffffffffffe2a0,(char *)in_stack_ffffffffffffe298);
              bVar1 = nlohmann::
                      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      ::get<bool,bool>((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                        *)in_stack_ffffffffffffe1d0);
              if (bVar1) {
                nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::operator[]<char_const>
                          (in_stack_ffffffffffffe2a0,(char *)in_stack_ffffffffffffe298);
                nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::get<std::__cxx11::string,std::__cxx11::string>
                          ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            *)in_stack_ffffffffffffe1d8);
                nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::operator[]<char_const>
                          (in_stack_ffffffffffffe2a0,(char *)in_stack_ffffffffffffe298);
                local_3b9 = nlohmann::
                            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            ::get<signed_char,signed_char>
                                      ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                        *)in_stack_ffffffffffffe1d0);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_3e0,"",&local_3e1);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_408,"/",&local_409);
                core::IO::DefineAttribute<signed_char>
                          ((IO *)CONCAT44(in_stack_ffffffffffffe64c,in_stack_ffffffffffffe648),
                           in_stack_ffffffffffffe640,(char *)in_stack_ffffffffffffe638,
                           (string *)in_stack_ffffffffffffe630._M_cur,in_stack_ffffffffffffe628,
                           (bool)in_stack_ffffffffffffe627);
                std::__cxx11::string::~string(local_408);
                std::allocator<char>::~allocator((allocator<char> *)&local_409);
                std::__cxx11::string::~string(local_3e0);
                std::allocator<char>::~allocator((allocator<char> *)&local_3e1);
                std::__cxx11::string::~string(local_3b8);
              }
              else {
                nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::operator[]<char_const>
                          (in_stack_ffffffffffffe2a0,(char *)in_stack_ffffffffffffe298);
                nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::get<std::__cxx11::string,std::__cxx11::string>
                          ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            *)in_stack_ffffffffffffe1d8);
                nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::operator[]<char_const>
                          (in_stack_ffffffffffffe2a0,(char *)in_stack_ffffffffffffe298);
                nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::
                get<std::vector<signed_char,std::allocator<signed_char>>,std::vector<signed_char,std::allocator<signed_char>>>
                          ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            *)in_stack_ffffffffffffe1d8);
                std::vector<signed_char,_std::allocator<signed_char>_>::data
                          ((vector<signed_char,_std::allocator<signed_char>_> *)0xdcb9a4);
                nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::operator[]<char_const>
                          (in_stack_ffffffffffffe2a0,(char *)in_stack_ffffffffffffe298);
                nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::
                get<std::vector<signed_char,std::allocator<signed_char>>,std::vector<signed_char,std::allocator<signed_char>>>
                          ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            *)in_stack_ffffffffffffe1d8);
                std::vector<signed_char,_std::allocator<signed_char>_>::size(local_460);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_480,"",&local_481);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_4a8,"/",&local_4a9);
                in_stack_ffffffffffffe1c8 = 0;
                core::IO::DefineAttribute<signed_char>
                          ((IO *)CONCAT44(in_stack_ffffffffffffe64c,in_stack_ffffffffffffe648),
                           in_stack_ffffffffffffe640,(char *)in_stack_ffffffffffffe638,
                           (size_t)in_stack_ffffffffffffe630._M_cur,in_stack_ffffffffffffe628,
                           (string *)CONCAT17(in_stack_ffffffffffffe627,in_stack_ffffffffffffe620),
                           SUB81((ulong)in_stack_ffffffffffffe618 >> 0x38,0));
                std::__cxx11::string::~string(local_4a8);
                std::allocator<char>::~allocator((allocator<char> *)&local_4a9);
                std::__cxx11::string::~string(local_480);
                std::allocator<char>::~allocator((allocator<char> *)&local_481);
                std::vector<signed_char,_std::allocator<signed_char>_>::~vector
                          ((vector<signed_char,_std::allocator<signed_char>_> *)
                           in_stack_ffffffffffffe1e0);
                std::vector<signed_char,_std::allocator<signed_char>_>::~vector
                          ((vector<signed_char,_std::allocator<signed_char>_> *)
                           in_stack_ffffffffffffe1e0);
                std::__cxx11::string::~string(local_430);
              }
            }
          }
          else {
            DVar4 = helper::GetDataType<short>();
            DVar3 = local_84;
            if (DVar5 == DVar4) {
              local_4b8 = core::IO::GetAttributes_abi_cxx11_(local_10);
              nlohmann::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ::operator[]<char_const>(in_stack_ffffffffffffe2a0,(char *)in_stack_ffffffffffffe298);
              nlohmann::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ::get<std::__cxx11::string,std::__cxx11::string>
                        ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)in_stack_ffffffffffffe1d8);
              local_4c0._M_cur =
                   (__node_type *)
                   std::
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>_>
                   ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>_>
                           *)CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8),
                          (key_type *)0xdcbc68);
              std::__cxx11::string::~string(local_4e0);
              local_4e8._M_cur =
                   (__node_type *)
                   std::
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>_>
                   ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>_>
                          *)CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8));
              bVar1 = std::__detail::operator==(&local_4c0,&local_4e8);
              if (bVar1) {
                nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::operator[]<char_const>
                          (in_stack_ffffffffffffe2a0,(char *)in_stack_ffffffffffffe298);
                bVar1 = nlohmann::
                        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                        ::get<bool,bool>((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                          *)in_stack_ffffffffffffe1d0);
                if (bVar1) {
                  nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::operator[]<char_const>
                            (in_stack_ffffffffffffe2a0,(char *)in_stack_ffffffffffffe298);
                  nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::get<std::__cxx11::string,std::__cxx11::string>
                            ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)in_stack_ffffffffffffe1d8);
                  nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::operator[]<char_const>
                            (in_stack_ffffffffffffe2a0,(char *)in_stack_ffffffffffffe298);
                  local_50a = nlohmann::
                              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                              ::get<short,short>((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                                  *)in_stack_ffffffffffffe1d0);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string(local_530,"",&local_531);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string(local_558,"/",&local_559);
                  core::IO::DefineAttribute<short>
                            ((IO *)CONCAT44(in_stack_ffffffffffffe64c,in_stack_ffffffffffffe648),
                             in_stack_ffffffffffffe640,(short *)in_stack_ffffffffffffe638,
                             (string *)in_stack_ffffffffffffe630._M_cur,in_stack_ffffffffffffe628,
                             (bool)in_stack_ffffffffffffe627);
                  std::__cxx11::string::~string(local_558);
                  std::allocator<char>::~allocator((allocator<char> *)&local_559);
                  std::__cxx11::string::~string(local_530);
                  std::allocator<char>::~allocator((allocator<char> *)&local_531);
                  std::__cxx11::string::~string(local_508);
                }
                else {
                  nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::operator[]<char_const>
                            (in_stack_ffffffffffffe2a0,(char *)in_stack_ffffffffffffe298);
                  nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::get<std::__cxx11::string,std::__cxx11::string>
                            ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)in_stack_ffffffffffffe1d8);
                  nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::operator[]<char_const>
                            (in_stack_ffffffffffffe2a0,(char *)in_stack_ffffffffffffe298);
                  nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::
                  get<std::vector<short,std::allocator<short>>,std::vector<short,std::allocator<short>>>
                            ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)in_stack_ffffffffffffe1d8);
                  std::vector<short,_std::allocator<short>_>::data
                            ((vector<short,_std::allocator<short>_> *)0xdcbfb7);
                  nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::operator[]<char_const>
                            (in_stack_ffffffffffffe2a0,(char *)in_stack_ffffffffffffe298);
                  nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::
                  get<std::vector<short,std::allocator<short>>,std::vector<short,std::allocator<short>>>
                            ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)in_stack_ffffffffffffe1d8);
                  std::vector<short,_std::allocator<short>_>::size(local_5b0);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string(local_5d0,"",&local_5d1);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string(local_5f8,"/",&local_5f9);
                  in_stack_ffffffffffffe1c8 = 0;
                  core::IO::DefineAttribute<short>
                            ((IO *)CONCAT44(in_stack_ffffffffffffe64c,in_stack_ffffffffffffe648),
                             in_stack_ffffffffffffe640,(short *)in_stack_ffffffffffffe638,
                             (size_t)in_stack_ffffffffffffe630._M_cur,in_stack_ffffffffffffe628,
                             (string *)CONCAT17(in_stack_ffffffffffffe627,in_stack_ffffffffffffe620)
                             ,SUB81((ulong)in_stack_ffffffffffffe618 >> 0x38,0));
                  std::__cxx11::string::~string(local_5f8);
                  std::allocator<char>::~allocator((allocator<char> *)&local_5f9);
                  std::__cxx11::string::~string(local_5d0);
                  std::allocator<char>::~allocator((allocator<char> *)&local_5d1);
                  std::vector<short,_std::allocator<short>_>::~vector
                            ((vector<short,_std::allocator<short>_> *)in_stack_ffffffffffffe1e0);
                  std::vector<short,_std::allocator<short>_>::~vector
                            ((vector<short,_std::allocator<short>_> *)in_stack_ffffffffffffe1e0);
                  std::__cxx11::string::~string(local_580);
                }
              }
            }
            else {
              DVar4 = helper::GetDataType<int>();
              DVar5 = local_84;
              if (DVar3 == DVar4) {
                local_608 = core::IO::GetAttributes_abi_cxx11_(local_10);
                nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::operator[]<char_const>
                          (in_stack_ffffffffffffe2a0,(char *)in_stack_ffffffffffffe298);
                nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::get<std::__cxx11::string,std::__cxx11::string>
                          ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            *)in_stack_ffffffffffffe1d8);
                local_610._M_cur =
                     (__node_type *)
                     std::
                     unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>_>
                     ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>_>
                             *)CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8),
                            (key_type *)0xdcc27b);
                std::__cxx11::string::~string(local_630);
                local_638._M_cur =
                     (__node_type *)
                     std::
                     unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>_>
                     ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>_>
                            *)CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8));
                bVar1 = std::__detail::operator==(&local_610,&local_638);
                if (bVar1) {
                  nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::operator[]<char_const>
                            (in_stack_ffffffffffffe2a0,(char *)in_stack_ffffffffffffe298);
                  bVar1 = nlohmann::
                          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                          ::get<bool,bool>((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                            *)in_stack_ffffffffffffe1d0);
                  if (bVar1) {
                    nlohmann::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    ::operator[]<char_const>
                              (in_stack_ffffffffffffe2a0,(char *)in_stack_ffffffffffffe298);
                    nlohmann::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    ::get<std::__cxx11::string,std::__cxx11::string>
                              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                *)in_stack_ffffffffffffe1d8);
                    nlohmann::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    ::operator[]<char_const>
                              (in_stack_ffffffffffffe2a0,(char *)in_stack_ffffffffffffe298);
                    local_65c = nlohmann::
                                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                ::get<int,int>((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                                *)in_stack_ffffffffffffe1d0);
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string(local_680,"",&local_681);
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string(local_6a8,"/",&local_6a9);
                    core::IO::DefineAttribute<int>
                              ((IO *)CONCAT44(in_stack_ffffffffffffe64c,in_stack_ffffffffffffe648),
                               in_stack_ffffffffffffe640,(int *)in_stack_ffffffffffffe638,
                               (string *)in_stack_ffffffffffffe630._M_cur,in_stack_ffffffffffffe628,
                               (bool)in_stack_ffffffffffffe627);
                    std::__cxx11::string::~string(local_6a8);
                    std::allocator<char>::~allocator((allocator<char> *)&local_6a9);
                    std::__cxx11::string::~string(local_680);
                    std::allocator<char>::~allocator((allocator<char> *)&local_681);
                    std::__cxx11::string::~string(local_658);
                  }
                  else {
                    nlohmann::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    ::operator[]<char_const>
                              (in_stack_ffffffffffffe2a0,(char *)in_stack_ffffffffffffe298);
                    nlohmann::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    ::get<std::__cxx11::string,std::__cxx11::string>
                              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                *)in_stack_ffffffffffffe1d8);
                    nlohmann::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    ::operator[]<char_const>
                              (in_stack_ffffffffffffe2a0,(char *)in_stack_ffffffffffffe298);
                    nlohmann::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    ::get<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>
                              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                *)in_stack_ffffffffffffe1d8);
                    std::vector<int,_std::allocator<int>_>::data
                              ((vector<int,_std::allocator<int>_> *)0xdcc5c7);
                    nlohmann::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    ::operator[]<char_const>
                              (in_stack_ffffffffffffe2a0,(char *)in_stack_ffffffffffffe298);
                    nlohmann::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    ::get<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>
                              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                *)in_stack_ffffffffffffe1d8);
                    std::vector<int,_std::allocator<int>_>::size(local_700);
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string(local_720,"",&local_721);
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string(local_748,"/",&local_749);
                    in_stack_ffffffffffffe1c8 = 0;
                    core::IO::DefineAttribute<int>
                              ((IO *)CONCAT44(in_stack_ffffffffffffe64c,in_stack_ffffffffffffe648),
                               in_stack_ffffffffffffe640,(int *)in_stack_ffffffffffffe638,
                               (size_t)in_stack_ffffffffffffe630._M_cur,in_stack_ffffffffffffe628,
                               (string *)
                               CONCAT17(in_stack_ffffffffffffe627,in_stack_ffffffffffffe620),
                               SUB81((ulong)in_stack_ffffffffffffe618 >> 0x38,0));
                    std::__cxx11::string::~string(local_748);
                    std::allocator<char>::~allocator((allocator<char> *)&local_749);
                    std::__cxx11::string::~string(local_720);
                    std::allocator<char>::~allocator((allocator<char> *)&local_721);
                    std::vector<int,_std::allocator<int>_>::~vector
                              ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe1e0);
                    std::vector<int,_std::allocator<int>_>::~vector
                              ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe1e0);
                    std::__cxx11::string::~string(local_6d0);
                  }
                }
              }
              else {
                DVar4 = helper::GetDataType<long>();
                DVar3 = local_84;
                if (DVar5 == DVar4) {
                  local_758 = core::IO::GetAttributes_abi_cxx11_(local_10);
                  nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::operator[]<char_const>
                            (in_stack_ffffffffffffe2a0,(char *)in_stack_ffffffffffffe298);
                  nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::get<std::__cxx11::string,std::__cxx11::string>
                            ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)in_stack_ffffffffffffe1d8);
                  local_760._M_cur =
                       (__node_type *)
                       std::
                       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>_>
                       ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>_>
                               *)CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8),
                              (key_type *)0xdcc88b);
                  std::__cxx11::string::~string(local_780);
                  local_788._M_cur =
                       (__node_type *)
                       std::
                       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>_>
                       ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>_>
                              *)CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8));
                  bVar1 = std::__detail::operator==(&local_760,&local_788);
                  if (bVar1) {
                    nlohmann::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    ::operator[]<char_const>
                              (in_stack_ffffffffffffe2a0,(char *)in_stack_ffffffffffffe298);
                    bVar1 = nlohmann::
                            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            ::get<bool,bool>((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                              *)in_stack_ffffffffffffe1d0);
                    if (bVar1) {
                      nlohmann::
                      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      ::operator[]<char_const>
                                (in_stack_ffffffffffffe2a0,(char *)in_stack_ffffffffffffe298);
                      nlohmann::
                      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      ::get<std::__cxx11::string,std::__cxx11::string>
                                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                  *)in_stack_ffffffffffffe1d8);
                      nlohmann::
                      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      ::operator[]<char_const>
                                (in_stack_ffffffffffffe2a0,(char *)in_stack_ffffffffffffe298);
                      local_7b0 = nlohmann::
                                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                  ::get<long,long>((
                                                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                                  *)in_stack_ffffffffffffe1d0);
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string(local_7d0,"",&local_7d1);
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string(local_7f8,"/",&local_7f9);
                      core::IO::DefineAttribute<long>
                                ((IO *)CONCAT44(in_stack_ffffffffffffe64c,in_stack_ffffffffffffe648)
                                 ,in_stack_ffffffffffffe640,(long *)in_stack_ffffffffffffe638,
                                 (string *)in_stack_ffffffffffffe630._M_cur,
                                 in_stack_ffffffffffffe628,(bool)in_stack_ffffffffffffe627);
                      std::__cxx11::string::~string(local_7f8);
                      std::allocator<char>::~allocator((allocator<char> *)&local_7f9);
                      std::__cxx11::string::~string(local_7d0);
                      std::allocator<char>::~allocator((allocator<char> *)&local_7d1);
                      std::__cxx11::string::~string(local_7a8);
                    }
                    else {
                      nlohmann::
                      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      ::operator[]<char_const>
                                (in_stack_ffffffffffffe2a0,(char *)in_stack_ffffffffffffe298);
                      nlohmann::
                      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      ::get<std::__cxx11::string,std::__cxx11::string>
                                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                  *)in_stack_ffffffffffffe1d8);
                      nlohmann::
                      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      ::operator[]<char_const>
                                (in_stack_ffffffffffffe2a0,(char *)in_stack_ffffffffffffe298);
                      nlohmann::
                      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      ::
                      get<std::vector<long,std::allocator<long>>,std::vector<long,std::allocator<long>>>
                                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                  *)in_stack_ffffffffffffe1d8);
                      std::vector<long,_std::allocator<long>_>::data
                                ((vector<long,_std::allocator<long>_> *)0xdccbda);
                      nlohmann::
                      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      ::operator[]<char_const>
                                (in_stack_ffffffffffffe2a0,(char *)in_stack_ffffffffffffe298);
                      nlohmann::
                      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      ::
                      get<std::vector<long,std::allocator<long>>,std::vector<long,std::allocator<long>>>
                                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                  *)in_stack_ffffffffffffe1d8);
                      std::vector<long,_std::allocator<long>_>::size(local_850);
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string(local_870,"",&local_871);
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string(local_898,"/",&local_899);
                      in_stack_ffffffffffffe1c8 = 0;
                      core::IO::DefineAttribute<long>
                                ((IO *)CONCAT44(in_stack_ffffffffffffe64c,in_stack_ffffffffffffe648)
                                 ,in_stack_ffffffffffffe640,(long *)in_stack_ffffffffffffe638,
                                 (size_t)in_stack_ffffffffffffe630._M_cur,in_stack_ffffffffffffe628,
                                 (string *)
                                 CONCAT17(in_stack_ffffffffffffe627,in_stack_ffffffffffffe620),
                                 SUB81((ulong)in_stack_ffffffffffffe618 >> 0x38,0));
                      std::__cxx11::string::~string(local_898);
                      std::allocator<char>::~allocator((allocator<char> *)&local_899);
                      std::__cxx11::string::~string(local_870);
                      std::allocator<char>::~allocator((allocator<char> *)&local_871);
                      std::vector<long,_std::allocator<long>_>::~vector
                                ((vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffe1e0);
                      std::vector<long,_std::allocator<long>_>::~vector
                                ((vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffe1e0);
                      std::__cxx11::string::~string(local_820);
                    }
                  }
                }
                else {
                  DVar4 = helper::GetDataType<unsigned_char>();
                  DVar5 = local_84;
                  if (DVar3 == DVar4) {
                    local_8a8 = core::IO::GetAttributes_abi_cxx11_(local_10);
                    nlohmann::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    ::operator[]<char_const>
                              (in_stack_ffffffffffffe2a0,(char *)in_stack_ffffffffffffe298);
                    nlohmann::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    ::get<std::__cxx11::string,std::__cxx11::string>
                              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                *)in_stack_ffffffffffffe1d8);
                    local_8b0._M_cur =
                         (__node_type *)
                         std::
                         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>_>
                         ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>_>
                                 *)CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8),
                                (key_type *)0xdcce9e);
                    std::__cxx11::string::~string(local_8d0);
                    local_8d8._M_cur =
                         (__node_type *)
                         std::
                         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>_>
                         ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>_>
                                *)CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8));
                    bVar1 = std::__detail::operator==(&local_8b0,&local_8d8);
                    if (bVar1) {
                      nlohmann::
                      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      ::operator[]<char_const>
                                (in_stack_ffffffffffffe2a0,(char *)in_stack_ffffffffffffe298);
                      bVar1 = nlohmann::
                              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                              ::get<bool,bool>((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                                *)in_stack_ffffffffffffe1d0);
                      if (bVar1) {
                        nlohmann::
                        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                        ::operator[]<char_const>
                                  (in_stack_ffffffffffffe2a0,(char *)in_stack_ffffffffffffe298);
                        nlohmann::
                        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                        ::get<std::__cxx11::string,std::__cxx11::string>
                                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                    *)in_stack_ffffffffffffe1d8);
                        nlohmann::
                        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                        ::operator[]<char_const>
                                  (in_stack_ffffffffffffe2a0,(char *)in_stack_ffffffffffffe298);
                        local_8f9 = nlohmann::
                                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                    ::get<unsigned_char,unsigned_char>
                                              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                                *)in_stack_ffffffffffffe1d0);
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string(local_920,"",&local_921);
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string(local_948,"/",&local_949);
                        core::IO::DefineAttribute<unsigned_char>
                                  ((IO *)CONCAT44(in_stack_ffffffffffffe64c,
                                                  in_stack_ffffffffffffe648),
                                   in_stack_ffffffffffffe640,(uchar *)in_stack_ffffffffffffe638,
                                   (string *)in_stack_ffffffffffffe630._M_cur,
                                   in_stack_ffffffffffffe628,(bool)in_stack_ffffffffffffe627);
                        std::__cxx11::string::~string(local_948);
                        std::allocator<char>::~allocator((allocator<char> *)&local_949);
                        std::__cxx11::string::~string(local_920);
                        std::allocator<char>::~allocator((allocator<char> *)&local_921);
                        std::__cxx11::string::~string(local_8f8);
                      }
                      else {
                        nlohmann::
                        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                        ::operator[]<char_const>
                                  (in_stack_ffffffffffffe2a0,(char *)in_stack_ffffffffffffe298);
                        nlohmann::
                        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                        ::get<std::__cxx11::string,std::__cxx11::string>
                                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                    *)in_stack_ffffffffffffe1d8);
                        nlohmann::
                        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                        ::operator[]<char_const>
                                  (in_stack_ffffffffffffe2a0,(char *)in_stack_ffffffffffffe298);
                        nlohmann::
                        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                        ::
                        get<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                    *)in_stack_ffffffffffffe1d8);
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0xdcd1ea
                                  );
                        nlohmann::
                        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                        ::operator[]<char_const>
                                  (in_stack_ffffffffffffe2a0,(char *)in_stack_ffffffffffffe298);
                        nlohmann::
                        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                        ::
                        get<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                    *)in_stack_ffffffffffffe1d8);
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_9a0);
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string(local_9c0,"",&local_9c1);
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string(local_9e8,"/",&local_9e9);
                        in_stack_ffffffffffffe1c8 = 0;
                        core::IO::DefineAttribute<unsigned_char>
                                  ((IO *)CONCAT44(in_stack_ffffffffffffe64c,
                                                  in_stack_ffffffffffffe648),
                                   in_stack_ffffffffffffe640,(uchar *)in_stack_ffffffffffffe638,
                                   (size_t)in_stack_ffffffffffffe630._M_cur,
                                   in_stack_ffffffffffffe628,
                                   (string *)
                                   CONCAT17(in_stack_ffffffffffffe627,in_stack_ffffffffffffe620),
                                   SUB81((ulong)in_stack_ffffffffffffe618 >> 0x38,0));
                        std::__cxx11::string::~string(local_9e8);
                        std::allocator<char>::~allocator((allocator<char> *)&local_9e9);
                        std::__cxx11::string::~string(local_9c0);
                        std::allocator<char>::~allocator((allocator<char> *)&local_9c1);
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   in_stack_ffffffffffffe1e0);
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   in_stack_ffffffffffffe1e0);
                        std::__cxx11::string::~string(local_970);
                      }
                    }
                  }
                  else {
                    DVar3 = helper::GetDataType<unsigned_short>();
                    if (DVar5 == DVar3) {
                      local_9f8 = core::IO::GetAttributes_abi_cxx11_(local_10);
                      nlohmann::
                      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      ::operator[]<char_const>
                                (in_stack_ffffffffffffe2a0,(char *)in_stack_ffffffffffffe298);
                      nlohmann::
                      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      ::get<std::__cxx11::string,std::__cxx11::string>
                                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                  *)in_stack_ffffffffffffe1d8);
                      local_a00._M_cur =
                           (__node_type *)
                           std::
                           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>_>
                           ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>_>
                                   *)CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8),
                                  (key_type *)0xdcd4ae);
                      std::__cxx11::string::~string(local_a20);
                      local_a28._M_cur =
                           (__node_type *)
                           std::
                           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>_>
                           ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>_>
                                  *)CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8));
                      bVar1 = std::__detail::operator==(&local_a00,&local_a28);
                      if (bVar1) {
                        nlohmann::
                        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                        ::operator[]<char_const>
                                  (in_stack_ffffffffffffe2a0,(char *)in_stack_ffffffffffffe298);
                        bVar1 = nlohmann::
                                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                ::get<bool,bool>((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                                  *)in_stack_ffffffffffffe1d0);
                        if (bVar1) {
                          nlohmann::
                          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                          ::operator[]<char_const>
                                    (in_stack_ffffffffffffe2a0,(char *)in_stack_ffffffffffffe298);
                          nlohmann::
                          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                          ::get<std::__cxx11::string,std::__cxx11::string>
                                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                      *)in_stack_ffffffffffffe1d8);
                          nlohmann::
                          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                          ::operator[]<char_const>
                                    (in_stack_ffffffffffffe2a0,(char *)in_stack_ffffffffffffe298);
                          local_a4a = nlohmann::
                                      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                      ::get<unsigned_short,unsigned_short>
                                                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                                  *)in_stack_ffffffffffffe1d0);
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string(local_a70,"",&local_a71);
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string(local_a98,"/",&local_a99);
                          core::IO::DefineAttribute<unsigned_short>
                                    ((IO *)CONCAT44(in_stack_ffffffffffffe64c,
                                                    in_stack_ffffffffffffe648),
                                     in_stack_ffffffffffffe640,
                                     (unsigned_short *)in_stack_ffffffffffffe638,
                                     (string *)in_stack_ffffffffffffe630._M_cur,
                                     in_stack_ffffffffffffe628,(bool)in_stack_ffffffffffffe627);
                          std::__cxx11::string::~string(local_a98);
                          std::allocator<char>::~allocator((allocator<char> *)&local_a99);
                          std::__cxx11::string::~string(local_a70);
                          std::allocator<char>::~allocator((allocator<char> *)&local_a71);
                          std::__cxx11::string::~string(local_a48);
                        }
                        else {
                          nlohmann::
                          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                          ::operator[]<char_const>
                                    (in_stack_ffffffffffffe2a0,(char *)in_stack_ffffffffffffe298);
                          nlohmann::
                          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                          ::get<std::__cxx11::string,std::__cxx11::string>
                                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                      *)in_stack_ffffffffffffe1d8);
                          nlohmann::
                          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                          ::operator[]<char_const>
                                    (in_stack_ffffffffffffe2a0,(char *)in_stack_ffffffffffffe298);
                          nlohmann::
                          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                          ::
                          get<std::vector<unsigned_short,std::allocator<unsigned_short>>,std::vector<unsigned_short,std::allocator<unsigned_short>>>
                                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                      *)in_stack_ffffffffffffe1d8);
                          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::data
                                    ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                                     0xdcd7fd);
                          nlohmann::
                          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                          ::operator[]<char_const>
                                    (in_stack_ffffffffffffe2a0,(char *)in_stack_ffffffffffffe298);
                          nlohmann::
                          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                          ::
                          get<std::vector<unsigned_short,std::allocator<unsigned_short>>,std::vector<unsigned_short,std::allocator<unsigned_short>>>
                                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                      *)in_stack_ffffffffffffe1d8);
                          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
                                    (local_af0);
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string(local_b10,"",&local_b11);
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string(local_b38,"/",&local_b39);
                          in_stack_ffffffffffffe1c8 = 0;
                          core::IO::DefineAttribute<unsigned_short>
                                    ((IO *)CONCAT44(in_stack_ffffffffffffe64c,
                                                    in_stack_ffffffffffffe648),
                                     in_stack_ffffffffffffe640,
                                     (unsigned_short *)in_stack_ffffffffffffe638,
                                     (size_t)in_stack_ffffffffffffe630._M_cur,
                                     in_stack_ffffffffffffe628,
                                     (string *)
                                     CONCAT17(in_stack_ffffffffffffe627,in_stack_ffffffffffffe620),
                                     SUB81((ulong)in_stack_ffffffffffffe618 >> 0x38,0));
                          std::__cxx11::string::~string(local_b38);
                          std::allocator<char>::~allocator((allocator<char> *)&local_b39);
                          std::__cxx11::string::~string(local_b10);
                          std::allocator<char>::~allocator((allocator<char> *)&local_b11);
                          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
                                    ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                                     in_stack_ffffffffffffe1e0);
                          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
                                    ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                                     in_stack_ffffffffffffe1e0);
                          std::__cxx11::string::~string(local_ac0);
                        }
                      }
                    }
                    else {
                      in_stack_ffffffffffffe64c = local_84;
                      DVar5 = helper::GetDataType<unsigned_int>();
                      DVar3 = local_84;
                      if (in_stack_ffffffffffffe64c == DVar5) {
                        in_stack_ffffffffffffe638 =
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             core::IO::GetAttributes_abi_cxx11_(local_10);
                        local_b48 = in_stack_ffffffffffffe638;
                        in_stack_ffffffffffffe640 =
                             (string *)
                             nlohmann::
                             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                             ::operator[]<char_const>
                                       (in_stack_ffffffffffffe2a0,(char *)in_stack_ffffffffffffe298)
                        ;
                        nlohmann::
                        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                        ::get<std::__cxx11::string,std::__cxx11::string>
                                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                    *)in_stack_ffffffffffffe1d8);
                        in_stack_ffffffffffffe630._M_cur =
                             (__node_type *)
                             std::
                             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>_>
                             ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>_>
                                     *)CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8)
                                    ,(key_type *)0xdcdac1);
                        local_b50._M_cur = in_stack_ffffffffffffe630._M_cur;
                        std::__cxx11::string::~string(local_b70);
                        local_b78._M_cur =
                             (__node_type *)
                             std::
                             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>_>
                             ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>_>
                                    *)CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8))
                        ;
                        bVar1 = std::__detail::operator==(&local_b50,&local_b78);
                        if (bVar1) {
                          in_stack_ffffffffffffe628 =
                               (string *)
                               nlohmann::
                               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                               ::operator[]<char_const>
                                         (in_stack_ffffffffffffe2a0,
                                          (char *)in_stack_ffffffffffffe298);
                          in_stack_ffffffffffffe627 =
                               nlohmann::
                               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                               ::get<bool,bool>((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                                 *)in_stack_ffffffffffffe1d0);
                          if ((bool)in_stack_ffffffffffffe627) {
                            in_stack_ffffffffffffe618 =
                                 nlohmann::
                                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                 ::operator[]<char_const>
                                           (in_stack_ffffffffffffe2a0,
                                            (char *)in_stack_ffffffffffffe298);
                            nlohmann::
                            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            ::get<std::__cxx11::string,std::__cxx11::string>
                                      ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                        *)in_stack_ffffffffffffe1d8);
                            nlohmann::
                            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            ::operator[]<char_const>
                                      (in_stack_ffffffffffffe2a0,(char *)in_stack_ffffffffffffe298);
                            local_b9c = nlohmann::
                                        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                        ::get<unsigned_int,unsigned_int>
                                                  ((
                                                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                                  *)in_stack_ffffffffffffe1d0);
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string(local_bc0,"",&local_bc1);
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string(local_be8,"/",&local_be9);
                            core::IO::DefineAttribute<unsigned_int>
                                      ((IO *)CONCAT44(in_stack_ffffffffffffe64c,
                                                      in_stack_ffffffffffffe648),
                                       in_stack_ffffffffffffe640,(uint *)in_stack_ffffffffffffe638,
                                       (string *)in_stack_ffffffffffffe630._M_cur,
                                       in_stack_ffffffffffffe628,(bool)in_stack_ffffffffffffe627);
                            std::__cxx11::string::~string(local_be8);
                            std::allocator<char>::~allocator((allocator<char> *)&local_be9);
                            std::__cxx11::string::~string(local_bc0);
                            std::allocator<char>::~allocator((allocator<char> *)&local_bc1);
                            std::__cxx11::string::~string(local_b98);
                          }
                          else {
                            nlohmann::
                            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            ::operator[]<char_const>
                                      (in_stack_ffffffffffffe2a0,(char *)in_stack_ffffffffffffe298);
                            nlohmann::
                            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            ::get<std::__cxx11::string,std::__cxx11::string>
                                      ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                        *)in_stack_ffffffffffffe1d8);
                            nlohmann::
                            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            ::operator[]<char_const>
                                      (in_stack_ffffffffffffe2a0,(char *)in_stack_ffffffffffffe298);
                            nlohmann::
                            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            ::
                            get<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::vector<unsigned_int,std::allocator<unsigned_int>>>
                                      ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                        *)in_stack_ffffffffffffe1d8);
                            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                       0xdcde0d);
                            nlohmann::
                            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            ::operator[]<char_const>
                                      (in_stack_ffffffffffffe2a0,(char *)in_stack_ffffffffffffe298);
                            nlohmann::
                            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            ::
                            get<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::vector<unsigned_int,std::allocator<unsigned_int>>>
                                      ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                        *)in_stack_ffffffffffffe1d8);
                            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                                      (local_c40);
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string(local_c60,"",&local_c61);
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string(local_c88,"/",&local_c89);
                            in_stack_ffffffffffffe1c8 = 0;
                            core::IO::DefineAttribute<unsigned_int>
                                      ((IO *)CONCAT44(in_stack_ffffffffffffe64c,
                                                      in_stack_ffffffffffffe648),
                                       in_stack_ffffffffffffe640,(uint *)in_stack_ffffffffffffe638,
                                       (size_t)in_stack_ffffffffffffe630._M_cur,
                                       in_stack_ffffffffffffe628,
                                       (string *)
                                       CONCAT17(in_stack_ffffffffffffe627,in_stack_ffffffffffffe620)
                                       ,SUB81((ulong)in_stack_ffffffffffffe618 >> 0x38,0));
                            std::__cxx11::string::~string(local_c88);
                            std::allocator<char>::~allocator((allocator<char> *)&local_c89);
                            std::__cxx11::string::~string(local_c60);
                            std::allocator<char>::~allocator((allocator<char> *)&local_c61);
                            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                       in_stack_ffffffffffffe1e0);
                            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                       in_stack_ffffffffffffe1e0);
                            std::__cxx11::string::~string(local_c10);
                          }
                        }
                      }
                      else {
                        DVar4 = helper::GetDataType<unsigned_long>();
                        DVar5 = local_84;
                        if (DVar3 == DVar4) {
                          local_c98 = core::IO::GetAttributes_abi_cxx11_(local_10);
                          nlohmann::
                          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                          ::operator[]<char_const>
                                    (in_stack_ffffffffffffe2a0,(char *)in_stack_ffffffffffffe298);
                          nlohmann::
                          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                          ::get<std::__cxx11::string,std::__cxx11::string>
                                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                      *)in_stack_ffffffffffffe1d8);
                          local_ca0._M_cur =
                               (__node_type *)
                               std::
                               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>_>
                               ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>_>
                                       *)CONCAT44(in_stack_ffffffffffffe1cc,
                                                  in_stack_ffffffffffffe1c8),(key_type *)0xdce0d1);
                          std::__cxx11::string::~string(local_cc0);
                          local_cc8._M_cur =
                               (__node_type *)
                               std::
                               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>_>
                               ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>_>
                                      *)CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8
                                                ));
                          bVar1 = std::__detail::operator==(&local_ca0,&local_cc8);
                          if (bVar1) {
                            nlohmann::
                            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            ::operator[]<char_const>
                                      (in_stack_ffffffffffffe2a0,(char *)in_stack_ffffffffffffe298);
                            bVar1 = nlohmann::
                                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                    ::get<bool,bool>((
                                                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                                  *)in_stack_ffffffffffffe1d0);
                            if (bVar1) {
                              nlohmann::
                              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                              ::operator[]<char_const>
                                        (in_stack_ffffffffffffe2a0,(char *)in_stack_ffffffffffffe298
                                        );
                              nlohmann::
                              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                              ::get<std::__cxx11::string,std::__cxx11::string>
                                        ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                          *)in_stack_ffffffffffffe1d8);
                              nlohmann::
                              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                              ::operator[]<char_const>
                                        (in_stack_ffffffffffffe2a0,(char *)in_stack_ffffffffffffe298
                                        );
                              local_cf0 = nlohmann::
                                          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                          ::get<unsigned_long,unsigned_long>
                                                    ((
                                                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                                  *)in_stack_ffffffffffffe1d0);
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string(local_d10,"",&local_d11);
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string(local_d38,"/",&local_d39);
                              core::IO::DefineAttribute<unsigned_long>
                                        ((IO *)CONCAT44(in_stack_ffffffffffffe64c,
                                                        in_stack_ffffffffffffe648),
                                         in_stack_ffffffffffffe640,
                                         (unsigned_long *)in_stack_ffffffffffffe638,
                                         (string *)in_stack_ffffffffffffe630._M_cur,
                                         in_stack_ffffffffffffe628,(bool)in_stack_ffffffffffffe627);
                              std::__cxx11::string::~string(local_d38);
                              std::allocator<char>::~allocator((allocator<char> *)&local_d39);
                              std::__cxx11::string::~string(local_d10);
                              std::allocator<char>::~allocator((allocator<char> *)&local_d11);
                              std::__cxx11::string::~string(local_ce8);
                            }
                            else {
                              nlohmann::
                              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                              ::operator[]<char_const>
                                        (in_stack_ffffffffffffe2a0,(char *)in_stack_ffffffffffffe298
                                        );
                              nlohmann::
                              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                              ::get<std::__cxx11::string,std::__cxx11::string>
                                        ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                          *)in_stack_ffffffffffffe1d8);
                              nlohmann::
                              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                              ::operator[]<char_const>
                                        (in_stack_ffffffffffffe2a0,(char *)in_stack_ffffffffffffe298
                                        );
                              nlohmann::
                              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                              ::
                              get<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<unsigned_long,std::allocator<unsigned_long>>>
                                        ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                          *)in_stack_ffffffffffffe1d8);
                              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                         0xdce420);
                              nlohmann::
                              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                              ::operator[]<char_const>
                                        (in_stack_ffffffffffffe2a0,(char *)in_stack_ffffffffffffe298
                                        );
                              nlohmann::
                              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                              ::
                              get<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<unsigned_long,std::allocator<unsigned_long>>>
                                        ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                          *)in_stack_ffffffffffffe1d8);
                              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                                        (local_d90);
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string(local_db0,"",&local_db1);
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string(local_dd8,"/",&local_dd9);
                              in_stack_ffffffffffffe1c8 = 0;
                              core::IO::DefineAttribute<unsigned_long>
                                        ((IO *)CONCAT44(in_stack_ffffffffffffe64c,
                                                        in_stack_ffffffffffffe648),
                                         in_stack_ffffffffffffe640,
                                         (unsigned_long *)in_stack_ffffffffffffe638,
                                         (size_t)in_stack_ffffffffffffe630._M_cur,
                                         in_stack_ffffffffffffe628,
                                         (string *)
                                         CONCAT17(in_stack_ffffffffffffe627,
                                                  in_stack_ffffffffffffe620),
                                         SUB81((ulong)in_stack_ffffffffffffe618 >> 0x38,0));
                              std::__cxx11::string::~string(local_dd8);
                              std::allocator<char>::~allocator((allocator<char> *)&local_dd9);
                              std::__cxx11::string::~string(local_db0);
                              std::allocator<char>::~allocator((allocator<char> *)&local_db1);
                              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                         in_stack_ffffffffffffe1e0);
                              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                         in_stack_ffffffffffffe1e0);
                              std::__cxx11::string::~string(local_d60);
                            }
                          }
                        }
                        else {
                          DVar4 = helper::GetDataType<float>();
                          DVar3 = local_84;
                          if (DVar5 == DVar4) {
                            local_de8 = core::IO::GetAttributes_abi_cxx11_(local_10);
                            nlohmann::
                            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            ::operator[]<char_const>
                                      (in_stack_ffffffffffffe2a0,(char *)in_stack_ffffffffffffe298);
                            nlohmann::
                            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            ::get<std::__cxx11::string,std::__cxx11::string>
                                      ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                        *)in_stack_ffffffffffffe1d8);
                            local_df0._M_cur =
                                 (__node_type *)
                                 std::
                                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>_>
                                 ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>_>
                                         *)CONCAT44(in_stack_ffffffffffffe1cc,
                                                    in_stack_ffffffffffffe1c8),(key_type *)0xdce6e4)
                            ;
                            std::__cxx11::string::~string(local_e10);
                            local_e18._M_cur =
                                 (__node_type *)
                                 std::
                                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>_>
                                 ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>_>
                                        *)CONCAT44(in_stack_ffffffffffffe1cc,
                                                   in_stack_ffffffffffffe1c8));
                            bVar1 = std::__detail::operator==(&local_df0,&local_e18);
                            if (bVar1) {
                              nlohmann::
                              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                              ::operator[]<char_const>
                                        (in_stack_ffffffffffffe2a0,(char *)in_stack_ffffffffffffe298
                                        );
                              bVar1 = nlohmann::
                                      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                      ::get<bool,bool>((
                                                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                                  *)in_stack_ffffffffffffe1d0);
                              if (bVar1) {
                                nlohmann::
                                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                ::operator[]<char_const>
                                          (in_stack_ffffffffffffe2a0,
                                           (char *)in_stack_ffffffffffffe298);
                                nlohmann::
                                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                ::get<std::__cxx11::string,std::__cxx11::string>
                                          ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                            *)in_stack_ffffffffffffe1d8);
                                nlohmann::
                                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                ::operator[]<char_const>
                                          (in_stack_ffffffffffffe2a0,
                                           (char *)in_stack_ffffffffffffe298);
                                local_e3c = nlohmann::
                                            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                            ::get<float,float>((
                                                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                                  *)in_stack_ffffffffffffe1d0);
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string(local_e60,"",&local_e61);
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string(local_e88,"/",&local_e89);
                                core::IO::DefineAttribute<float>
                                          ((IO *)CONCAT44(in_stack_ffffffffffffe64c,
                                                          in_stack_ffffffffffffe648),
                                           in_stack_ffffffffffffe640,
                                           (float *)in_stack_ffffffffffffe638,
                                           (string *)in_stack_ffffffffffffe630._M_cur,
                                           in_stack_ffffffffffffe628,(bool)in_stack_ffffffffffffe627
                                          );
                                std::__cxx11::string::~string(local_e88);
                                std::allocator<char>::~allocator((allocator<char> *)&local_e89);
                                std::__cxx11::string::~string(local_e60);
                                std::allocator<char>::~allocator((allocator<char> *)&local_e61);
                                std::__cxx11::string::~string(local_e38);
                              }
                              else {
                                nlohmann::
                                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                ::operator[]<char_const>
                                          (in_stack_ffffffffffffe2a0,
                                           (char *)in_stack_ffffffffffffe298);
                                nlohmann::
                                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                ::get<std::__cxx11::string,std::__cxx11::string>
                                          ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                            *)in_stack_ffffffffffffe1d8);
                                nlohmann::
                                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                ::operator[]<char_const>
                                          (in_stack_ffffffffffffe2a0,
                                           (char *)in_stack_ffffffffffffe298);
                                nlohmann::
                                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                ::
                                get<std::vector<float,std::allocator<float>>,std::vector<float,std::allocator<float>>>
                                          ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                            *)in_stack_ffffffffffffe1d8);
                                std::vector<float,_std::allocator<float>_>::data
                                          ((vector<float,_std::allocator<float>_> *)0xdcea36);
                                nlohmann::
                                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                ::operator[]<char_const>
                                          (in_stack_ffffffffffffe2a0,
                                           (char *)in_stack_ffffffffffffe298);
                                nlohmann::
                                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                ::
                                get<std::vector<float,std::allocator<float>>,std::vector<float,std::allocator<float>>>
                                          ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                            *)in_stack_ffffffffffffe1d8);
                                std::vector<float,_std::allocator<float>_>::size(local_ee0);
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string(local_f00,"",&local_f01);
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string(local_f28,"/",&local_f29);
                                in_stack_ffffffffffffe1c8 = 0;
                                core::IO::DefineAttribute<float>
                                          ((IO *)CONCAT44(in_stack_ffffffffffffe64c,
                                                          in_stack_ffffffffffffe648),
                                           in_stack_ffffffffffffe640,
                                           (float *)in_stack_ffffffffffffe638,
                                           (size_t)in_stack_ffffffffffffe630._M_cur,
                                           in_stack_ffffffffffffe628,
                                           (string *)
                                           CONCAT17(in_stack_ffffffffffffe627,
                                                    in_stack_ffffffffffffe620),
                                           SUB81((ulong)in_stack_ffffffffffffe618 >> 0x38,0));
                                std::__cxx11::string::~string(local_f28);
                                std::allocator<char>::~allocator((allocator<char> *)&local_f29);
                                std::__cxx11::string::~string(local_f00);
                                std::allocator<char>::~allocator((allocator<char> *)&local_f01);
                                std::vector<float,_std::allocator<float>_>::~vector
                                          ((vector<float,_std::allocator<float>_> *)
                                           in_stack_ffffffffffffe1e0);
                                std::vector<float,_std::allocator<float>_>::~vector
                                          ((vector<float,_std::allocator<float>_> *)
                                           in_stack_ffffffffffffe1e0);
                                std::__cxx11::string::~string(local_eb0);
                              }
                            }
                          }
                          else {
                            DVar4 = helper::GetDataType<double>();
                            DVar5 = local_84;
                            if (DVar3 == DVar4) {
                              local_f38 = core::IO::GetAttributes_abi_cxx11_(local_10);
                              nlohmann::
                              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                              ::operator[]<char_const>
                                        (in_stack_ffffffffffffe2a0,(char *)in_stack_ffffffffffffe298
                                        );
                              nlohmann::
                              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                              ::get<std::__cxx11::string,std::__cxx11::string>
                                        ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                          *)in_stack_ffffffffffffe1d8);
                              local_f40._M_cur =
                                   (__node_type *)
                                   std::
                                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>_>
                                   ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>_>
                                           *)CONCAT44(in_stack_ffffffffffffe1cc,
                                                      in_stack_ffffffffffffe1c8),
                                          (key_type *)0xdcecfa);
                              std::__cxx11::string::~string(local_f60);
                              local_f68._M_cur =
                                   (__node_type *)
                                   std::
                                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>_>
                                   ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>_>
                                          *)CONCAT44(in_stack_ffffffffffffe1cc,
                                                     in_stack_ffffffffffffe1c8));
                              bVar1 = std::__detail::operator==(&local_f40,&local_f68);
                              if (bVar1) {
                                nlohmann::
                                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                ::operator[]<char_const>
                                          (in_stack_ffffffffffffe2a0,
                                           (char *)in_stack_ffffffffffffe298);
                                bVar1 = nlohmann::
                                        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                        ::get<bool,bool>((
                                                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                                  *)in_stack_ffffffffffffe1d0);
                                if (bVar1) {
                                  nlohmann::
                                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                  ::operator[]<char_const>
                                            (in_stack_ffffffffffffe2a0,
                                             (char *)in_stack_ffffffffffffe298);
                                  nlohmann::
                                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                  ::get<std::__cxx11::string,std::__cxx11::string>
                                            ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                              *)in_stack_ffffffffffffe1d8);
                                  nlohmann::
                                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                  ::operator[]<char_const>
                                            (in_stack_ffffffffffffe2a0,
                                             (char *)in_stack_ffffffffffffe298);
                                  local_f90 = nlohmann::
                                              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                              ::get<double,double>
                                                        ((
                                                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                                  *)in_stack_ffffffffffffe1d0);
                                  std::allocator<char>::allocator();
                                  std::__cxx11::string::string(local_fb0,"",&local_fb1);
                                  std::allocator<char>::allocator();
                                  std::__cxx11::string::string(local_fd8,"/",&local_fd9);
                                  core::IO::DefineAttribute<double>
                                            ((IO *)CONCAT44(in_stack_ffffffffffffe64c,
                                                            in_stack_ffffffffffffe648),
                                             in_stack_ffffffffffffe640,
                                             (double *)in_stack_ffffffffffffe638,
                                             (string *)in_stack_ffffffffffffe630._M_cur,
                                             in_stack_ffffffffffffe628,
                                             (bool)in_stack_ffffffffffffe627);
                                  std::__cxx11::string::~string(local_fd8);
                                  std::allocator<char>::~allocator((allocator<char> *)&local_fd9);
                                  std::__cxx11::string::~string(local_fb0);
                                  std::allocator<char>::~allocator((allocator<char> *)&local_fb1);
                                  std::__cxx11::string::~string(local_f88);
                                }
                                else {
                                  nlohmann::
                                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                  ::operator[]<char_const>
                                            (in_stack_ffffffffffffe2a0,
                                             (char *)in_stack_ffffffffffffe298);
                                  nlohmann::
                                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                  ::get<std::__cxx11::string,std::__cxx11::string>
                                            ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                              *)in_stack_ffffffffffffe1d8);
                                  nlohmann::
                                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                  ::operator[]<char_const>
                                            (in_stack_ffffffffffffe2a0,
                                             (char *)in_stack_ffffffffffffe298);
                                  nlohmann::
                                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                  ::
                                  get<std::vector<double,std::allocator<double>>,std::vector<double,std::allocator<double>>>
                                            ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                              *)in_stack_ffffffffffffe1d8);
                                  std::vector<double,_std::allocator<double>_>::data
                                            ((vector<double,_std::allocator<double>_> *)0xdcf04c);
                                  nlohmann::
                                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                  ::operator[]<char_const>
                                            (in_stack_ffffffffffffe2a0,
                                             (char *)in_stack_ffffffffffffe298);
                                  nlohmann::
                                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                  ::
                                  get<std::vector<double,std::allocator<double>>,std::vector<double,std::allocator<double>>>
                                            ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                              *)in_stack_ffffffffffffe1d8);
                                  std::vector<double,_std::allocator<double>_>::size(local_1030);
                                  std::allocator<char>::allocator();
                                  std::__cxx11::string::string(local_1050,"",&local_1051);
                                  std::allocator<char>::allocator();
                                  std::__cxx11::string::string(local_1078,"/",&local_1079);
                                  in_stack_ffffffffffffe1c8 = 0;
                                  core::IO::DefineAttribute<double>
                                            ((IO *)CONCAT44(in_stack_ffffffffffffe64c,
                                                            in_stack_ffffffffffffe648),
                                             in_stack_ffffffffffffe640,
                                             (double *)in_stack_ffffffffffffe638,
                                             (size_t)in_stack_ffffffffffffe630._M_cur,
                                             in_stack_ffffffffffffe628,
                                             (string *)
                                             CONCAT17(in_stack_ffffffffffffe627,
                                                      in_stack_ffffffffffffe620),
                                             SUB81((ulong)in_stack_ffffffffffffe618 >> 0x38,0));
                                  std::__cxx11::string::~string(local_1078);
                                  std::allocator<char>::~allocator((allocator<char> *)&local_1079);
                                  std::__cxx11::string::~string(local_1050);
                                  std::allocator<char>::~allocator((allocator<char> *)&local_1051);
                                  std::vector<double,_std::allocator<double>_>::~vector
                                            ((vector<double,_std::allocator<double>_> *)
                                             in_stack_ffffffffffffe1e0);
                                  std::vector<double,_std::allocator<double>_>::~vector
                                            ((vector<double,_std::allocator<double>_> *)
                                             in_stack_ffffffffffffe1e0);
                                  std::__cxx11::string::~string(local_1000);
                                }
                              }
                            }
                            else {
                              DVar4 = helper::GetDataType<long_double>();
                              DVar3 = local_84;
                              if (DVar5 == DVar4) {
                                local_1088 = core::IO::GetAttributes_abi_cxx11_(local_10);
                                nlohmann::
                                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                ::operator[]<char_const>
                                          (in_stack_ffffffffffffe2a0,
                                           (char *)in_stack_ffffffffffffe298);
                                nlohmann::
                                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                ::get<std::__cxx11::string,std::__cxx11::string>
                                          ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                            *)in_stack_ffffffffffffe1d8);
                                local_1090._M_cur =
                                     (__node_type *)
                                     std::
                                     unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>_>
                                     ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>_>
                                             *)CONCAT44(in_stack_ffffffffffffe1cc,
                                                        in_stack_ffffffffffffe1c8),
                                            (key_type *)0xdcf310);
                                std::__cxx11::string::~string(local_10b0);
                                local_10b8._M_cur =
                                     (__node_type *)
                                     std::
                                     unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>_>
                                     ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>_>
                                            *)CONCAT44(in_stack_ffffffffffffe1cc,
                                                       in_stack_ffffffffffffe1c8));
                                bVar1 = std::__detail::operator==(&local_1090,&local_10b8);
                                if (bVar1) {
                                  nlohmann::
                                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                  ::operator[]<char_const>
                                            (in_stack_ffffffffffffe2a0,
                                             (char *)in_stack_ffffffffffffe298);
                                  bVar1 = nlohmann::
                                          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                          ::get<bool,bool>((
                                                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                                  *)in_stack_ffffffffffffe1d0);
                                  if (bVar1) {
                                    nlohmann::
                                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                    ::operator[]<char_const>
                                              (in_stack_ffffffffffffe2a0,
                                               (char *)in_stack_ffffffffffffe298);
                                    nlohmann::
                                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                    ::get<std::__cxx11::string,std::__cxx11::string>
                                              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                                *)in_stack_ffffffffffffe1d8);
                                    nlohmann::
                                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                    ::operator[]<char_const>
                                              (in_stack_ffffffffffffe2a0,
                                               (char *)in_stack_ffffffffffffe298);
                                    nlohmann::
                                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                    ::get<long_double,long_double>
                                              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                                *)in_stack_ffffffffffffe1d0);
                                    std::allocator<char>::allocator();
                                    std::__cxx11::string::string(local_1108,"",&local_1109);
                                    std::allocator<char>::allocator();
                                    std::__cxx11::string::string(local_1130,"/",&local_1131);
                                    core::IO::DefineAttribute<long_double>
                                              ((IO *)CONCAT44(in_stack_ffffffffffffe64c,
                                                              in_stack_ffffffffffffe648),
                                               in_stack_ffffffffffffe640,
                                               (longdouble *)in_stack_ffffffffffffe638,
                                               (string *)in_stack_ffffffffffffe630._M_cur,
                                               in_stack_ffffffffffffe628,
                                               (bool)in_stack_ffffffffffffe627);
                                    std::__cxx11::string::~string(local_1130);
                                    std::allocator<char>::~allocator((allocator<char> *)&local_1131)
                                    ;
                                    std::__cxx11::string::~string(local_1108);
                                    std::allocator<char>::~allocator((allocator<char> *)&local_1109)
                                    ;
                                    std::__cxx11::string::~string(local_10d8);
                                  }
                                  else {
                                    nlohmann::
                                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                    ::operator[]<char_const>
                                              (in_stack_ffffffffffffe2a0,
                                               (char *)in_stack_ffffffffffffe298);
                                    nlohmann::
                                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                    ::get<std::__cxx11::string,std::__cxx11::string>
                                              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                                *)in_stack_ffffffffffffe1d8);
                                    nlohmann::
                                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                    ::operator[]<char_const>
                                              (in_stack_ffffffffffffe2a0,
                                               (char *)in_stack_ffffffffffffe298);
                                    nlohmann::
                                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                    ::
                                    get<std::vector<long_double,std::allocator<long_double>>,std::vector<long_double,std::allocator<long_double>>>
                                              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                                *)in_stack_ffffffffffffe1d8);
                                    std::vector<long_double,_std::allocator<long_double>_>::data
                                              ((vector<long_double,_std::allocator<long_double>_> *)
                                               0xdcf65c);
                                    nlohmann::
                                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                    ::operator[]<char_const>
                                              (in_stack_ffffffffffffe2a0,
                                               (char *)in_stack_ffffffffffffe298);
                                    nlohmann::
                                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                    ::
                                    get<std::vector<long_double,std::allocator<long_double>>,std::vector<long_double,std::allocator<long_double>>>
                                              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                                *)in_stack_ffffffffffffe1d8);
                                    std::vector<long_double,_std::allocator<long_double>_>::size
                                              (local_1188);
                                    std::allocator<char>::allocator();
                                    std::__cxx11::string::string(local_11a8,"",&local_11a9);
                                    std::allocator<char>::allocator();
                                    std::__cxx11::string::string(local_11d0,"/",&local_11d1);
                                    in_stack_ffffffffffffe1c8 = 0;
                                    core::IO::DefineAttribute<long_double>
                                              ((IO *)CONCAT44(in_stack_ffffffffffffe64c,
                                                              in_stack_ffffffffffffe648),
                                               in_stack_ffffffffffffe640,
                                               (longdouble *)in_stack_ffffffffffffe638,
                                               (size_t)in_stack_ffffffffffffe630._M_cur,
                                               in_stack_ffffffffffffe628,
                                               (string *)
                                               CONCAT17(in_stack_ffffffffffffe627,
                                                        in_stack_ffffffffffffe620),
                                               SUB81((ulong)in_stack_ffffffffffffe618 >> 0x38,0));
                                    std::__cxx11::string::~string(local_11d0);
                                    std::allocator<char>::~allocator((allocator<char> *)&local_11d1)
                                    ;
                                    std::__cxx11::string::~string(local_11a8);
                                    std::allocator<char>::~allocator((allocator<char> *)&local_11a9)
                                    ;
                                    std::vector<long_double,_std::allocator<long_double>_>::~vector
                                              ((vector<long_double,_std::allocator<long_double>_> *)
                                               in_stack_ffffffffffffe1e0);
                                    std::vector<long_double,_std::allocator<long_double>_>::~vector
                                              ((vector<long_double,_std::allocator<long_double>_> *)
                                               in_stack_ffffffffffffe1e0);
                                    std::__cxx11::string::~string(local_1158);
                                  }
                                }
                              }
                              else {
                                DVar4 = helper::GetDataType<std::complex<float>>();
                                DVar5 = local_84;
                                if (DVar3 == DVar4) {
                                  local_11e0 = core::IO::GetAttributes_abi_cxx11_(local_10);
                                  nlohmann::
                                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                  ::operator[]<char_const>
                                            (in_stack_ffffffffffffe2a0,
                                             (char *)in_stack_ffffffffffffe298);
                                  nlohmann::
                                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                  ::get<std::__cxx11::string,std::__cxx11::string>
                                            ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                              *)in_stack_ffffffffffffe1d8);
                                  local_11e8._M_cur =
                                       (__node_type *)
                                       std::
                                       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>_>
                                       ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>_>
                                               *)CONCAT44(in_stack_ffffffffffffe1cc,
                                                          in_stack_ffffffffffffe1c8),
                                              (key_type *)0xdcf920);
                                  std::__cxx11::string::~string(local_1208);
                                  local_1210._M_cur =
                                       (__node_type *)
                                       std::
                                       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>_>
                                       ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>_>
                                              *)CONCAT44(in_stack_ffffffffffffe1cc,
                                                         in_stack_ffffffffffffe1c8));
                                  bVar1 = std::__detail::operator==(&local_11e8,&local_1210);
                                  if (bVar1) {
                                    nlohmann::
                                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                    ::operator[]<char_const>
                                              (in_stack_ffffffffffffe2a0,
                                               (char *)in_stack_ffffffffffffe298);
                                    bVar1 = nlohmann::
                                            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                            ::get<bool,bool>((
                                                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                                  *)in_stack_ffffffffffffe1d0);
                                    if (bVar1) {
                                      nlohmann::
                                      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                      ::operator[]<char_const>
                                                (in_stack_ffffffffffffe2a0,
                                                 (char *)in_stack_ffffffffffffe298);
                                      nlohmann::
                                      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                      ::get<std::__cxx11::string,std::__cxx11::string>
                                                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                                  *)in_stack_ffffffffffffe1d8);
                                      nlohmann::
                                      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                      ::operator[]<char_const>
                                                (in_stack_ffffffffffffe2a0,
                                                 (char *)in_stack_ffffffffffffe298);
                                      nlohmann::
                                      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                      ::get<std::complex<float>,std::complex<float>>
                                                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                                  *)CONCAT44(in_stack_ffffffffffffe1cc,
                                                             in_stack_ffffffffffffe1c8));
                                      std::allocator<char>::allocator();
                                      std::__cxx11::string::string(local_1258,"",&local_1259);
                                      std::allocator<char>::allocator();
                                      std::__cxx11::string::string(local_1280,"/",&local_1281);
                                      core::IO::DefineAttribute<std::complex<float>>
                                                ((IO *)CONCAT44(in_stack_ffffffffffffe64c,
                                                                in_stack_ffffffffffffe648),
                                                 in_stack_ffffffffffffe640,
                                                 (complex<float> *)in_stack_ffffffffffffe638,
                                                 (string *)in_stack_ffffffffffffe630._M_cur,
                                                 in_stack_ffffffffffffe628,
                                                 (bool)in_stack_ffffffffffffe627);
                                      std::__cxx11::string::~string(local_1280);
                                      std::allocator<char>::~allocator
                                                ((allocator<char> *)&local_1281);
                                      std::__cxx11::string::~string(local_1258);
                                      std::allocator<char>::~allocator
                                                ((allocator<char> *)&local_1259);
                                      std::__cxx11::string::~string(local_1230);
                                    }
                                    else {
                                      nlohmann::
                                      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                      ::operator[]<char_const>
                                                (in_stack_ffffffffffffe2a0,
                                                 (char *)in_stack_ffffffffffffe298);
                                      nlohmann::
                                      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                      ::get<std::__cxx11::string,std::__cxx11::string>
                                                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                                  *)in_stack_ffffffffffffe1d8);
                                      in_stack_ffffffffffffe2a0 =
                                           nlohmann::
                                           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                           ::operator[]<char_const>
                                                     (in_stack_ffffffffffffe2a0,
                                                      (char *)in_stack_ffffffffffffe298);
                                      nlohmann::
                                      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                      ::
                                      get<std::vector<std::complex<float>,std::allocator<std::complex<float>>>,std::vector<std::complex<float>,std::allocator<std::complex<float>>>>
                                                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                                  *)in_stack_ffffffffffffe1d8);
                                      std::
                                      vector<std::complex<float>,_std::allocator<std::complex<float>_>_>
                                      ::data((vector<std::complex<float>,_std::allocator<std::complex<float>_>_>
                                              *)0xdcfc70);
                                      in_stack_ffffffffffffe298 =
                                           nlohmann::
                                           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                           ::operator[]<char_const>
                                                     (in_stack_ffffffffffffe2a0,
                                                      (char *)in_stack_ffffffffffffe298);
                                      nlohmann::
                                      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                      ::
                                      get<std::vector<std::complex<float>,std::allocator<std::complex<float>>>,std::vector<std::complex<float>,std::allocator<std::complex<float>>>>
                                                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                                  *)in_stack_ffffffffffffe1d8);
                                      std::
                                      vector<std::complex<float>,_std::allocator<std::complex<float>_>_>
                                      ::size(local_12d8);
                                      std::allocator<char>::allocator();
                                      std::__cxx11::string::string(local_12f8,"",&local_12f9);
                                      std::allocator<char>::allocator();
                                      std::__cxx11::string::string(local_1320,"/",&local_1321);
                                      in_stack_ffffffffffffe1c8 = 0;
                                      core::IO::DefineAttribute<std::complex<float>>
                                                ((IO *)CONCAT44(in_stack_ffffffffffffe64c,
                                                                in_stack_ffffffffffffe648),
                                                 in_stack_ffffffffffffe640,
                                                 (complex<float> *)in_stack_ffffffffffffe638,
                                                 (size_t)in_stack_ffffffffffffe630._M_cur,
                                                 in_stack_ffffffffffffe628,
                                                 (string *)
                                                 CONCAT17(in_stack_ffffffffffffe627,
                                                          in_stack_ffffffffffffe620),
                                                 SUB81((ulong)in_stack_ffffffffffffe618 >> 0x38,0));
                                      std::__cxx11::string::~string(local_1320);
                                      std::allocator<char>::~allocator
                                                ((allocator<char> *)&local_1321);
                                      std::__cxx11::string::~string(local_12f8);
                                      std::allocator<char>::~allocator
                                                ((allocator<char> *)&local_12f9);
                                      std::
                                      vector<std::complex<float>,_std::allocator<std::complex<float>_>_>
                                      ::~vector((vector<std::complex<float>,_std::allocator<std::complex<float>_>_>
                                                 *)in_stack_ffffffffffffe1e0);
                                      std::
                                      vector<std::complex<float>,_std::allocator<std::complex<float>_>_>
                                      ::~vector((vector<std::complex<float>,_std::allocator<std::complex<float>_>_>
                                                 *)in_stack_ffffffffffffe1e0);
                                      std::__cxx11::string::~string(local_12a8);
                                    }
                                  }
                                }
                                else {
                                  DVar3 = helper::GetDataType<std::complex<double>>();
                                  if (DVar5 == DVar3) {
                                    local_1330 = core::IO::GetAttributes_abi_cxx11_(local_10);
                                    nlohmann::
                                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                    ::operator[]<char_const>
                                              (in_stack_ffffffffffffe2a0,
                                               (char *)in_stack_ffffffffffffe298);
                                    nlohmann::
                                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                    ::get<std::__cxx11::string,std::__cxx11::string>
                                              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                                *)in_stack_ffffffffffffe1d8);
                                    in_stack_ffffffffffffe258._M_cur =
                                         (__node_type *)
                                         std::
                                         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>_>
                                         ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>_>
                                                 *)CONCAT44(in_stack_ffffffffffffe1cc,
                                                            in_stack_ffffffffffffe1c8),
                                                (key_type *)0xdcff34);
                                    local_1338._M_cur = in_stack_ffffffffffffe258._M_cur;
                                    std::__cxx11::string::~string(local_1358);
                                    local_1360._M_cur =
                                         (__node_type *)
                                         std::
                                         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>_>
                                         ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>_>
                                                *)CONCAT44(in_stack_ffffffffffffe1cc,
                                                           in_stack_ffffffffffffe1c8));
                                    bVar1 = std::__detail::operator==(&local_1338,&local_1360);
                                    if (bVar1) {
                                      nlohmann::
                                      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                      ::operator[]<char_const>
                                                (in_stack_ffffffffffffe2a0,
                                                 (char *)in_stack_ffffffffffffe298);
                                      bVar1 = nlohmann::
                                              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                              ::get<bool,bool>((
                                                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                                  *)in_stack_ffffffffffffe1d0);
                                      if (bVar1) {
                                        nlohmann::
                                        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                        ::operator[]<char_const>
                                                  (in_stack_ffffffffffffe2a0,
                                                   (char *)in_stack_ffffffffffffe298);
                                        nlohmann::
                                        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                        ::get<std::__cxx11::string,std::__cxx11::string>
                                                  ((
                                                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                                  *)in_stack_ffffffffffffe1d8);
                                        nlohmann::
                                        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                        ::operator[]<char_const>
                                                  (in_stack_ffffffffffffe2a0,
                                                   (char *)in_stack_ffffffffffffe298);
                                        nlohmann::
                                        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                        ::get<std::complex<double>,std::complex<double>>
                                                  ((
                                                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                                  *)in_stack_ffffffffffffe1d0);
                                        std::allocator<char>::allocator();
                                        std::__cxx11::string::string(local_13b0,"",&local_13b1);
                                        std::allocator<char>::allocator();
                                        std::__cxx11::string::string(local_13d8,"/",&local_13d9);
                                        core::IO::DefineAttribute<std::complex<double>>
                                                  ((IO *)CONCAT44(in_stack_ffffffffffffe64c,
                                                                  in_stack_ffffffffffffe648),
                                                   in_stack_ffffffffffffe640,
                                                   (complex<double> *)in_stack_ffffffffffffe638,
                                                   (string *)in_stack_ffffffffffffe630._M_cur,
                                                   in_stack_ffffffffffffe628,
                                                   (bool)in_stack_ffffffffffffe627);
                                        std::__cxx11::string::~string(local_13d8);
                                        std::allocator<char>::~allocator
                                                  ((allocator<char> *)&local_13d9);
                                        std::__cxx11::string::~string(local_13b0);
                                        std::allocator<char>::~allocator
                                                  ((allocator<char> *)&local_13b1);
                                        std::__cxx11::string::~string(local_1380);
                                      }
                                      else {
                                        nlohmann::
                                        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                        ::operator[]<char_const>
                                                  (in_stack_ffffffffffffe2a0,
                                                   (char *)in_stack_ffffffffffffe298);
                                        nlohmann::
                                        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                        ::get<std::__cxx11::string,std::__cxx11::string>
                                                  ((
                                                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                                  *)in_stack_ffffffffffffe1d8);
                                        nlohmann::
                                        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                        ::operator[]<char_const>
                                                  (in_stack_ffffffffffffe2a0,
                                                   (char *)in_stack_ffffffffffffe298);
                                        nlohmann::
                                        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                        ::
                                        get<std::vector<std::complex<double>,std::allocator<std::complex<double>>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>>
                                                  ((
                                                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                                  *)in_stack_ffffffffffffe1d8);
                                        std::
                                        vector<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                        ::data((vector<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                                *)0xdd0268);
                                        nlohmann::
                                        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                        ::operator[]<char_const>
                                                  (in_stack_ffffffffffffe2a0,
                                                   (char *)in_stack_ffffffffffffe298);
                                        nlohmann::
                                        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                        ::
                                        get<std::vector<std::complex<double>,std::allocator<std::complex<double>>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>>
                                                  ((
                                                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                                  *)in_stack_ffffffffffffe1d8);
                                        in_stack_ffffffffffffe1d8 =
                                             (string *)
                                             std::
                                             vector<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                             ::size(local_1430);
                                        in_stack_ffffffffffffe1e0 = &local_1451;
                                        std::allocator<char>::allocator();
                                        std::__cxx11::string::string
                                                  (local_1450,"",in_stack_ffffffffffffe1e0);
                                        in_stack_ffffffffffffe1d0 =
                                             (iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                              *)local_1479;
                                        std::allocator<char>::allocator();
                                        std::__cxx11::string::string
                                                  ((string *)(local_1479 + 1),"/",
                                                   (allocator *)in_stack_ffffffffffffe1d0);
                                        in_stack_ffffffffffffe1c8 = 0;
                                        core::IO::DefineAttribute<std::complex<double>>
                                                  ((IO *)CONCAT44(in_stack_ffffffffffffe64c,
                                                                  in_stack_ffffffffffffe648),
                                                   in_stack_ffffffffffffe640,
                                                   (complex<double> *)in_stack_ffffffffffffe638,
                                                   (size_t)in_stack_ffffffffffffe630._M_cur,
                                                   in_stack_ffffffffffffe628,
                                                   (string *)
                                                   CONCAT17(in_stack_ffffffffffffe627,
                                                            in_stack_ffffffffffffe620),
                                                   SUB81((ulong)in_stack_ffffffffffffe618 >> 0x38,0)
                                                  );
                                        std::__cxx11::string::~string((string *)(local_1479 + 1));
                                        std::allocator<char>::~allocator
                                                  ((allocator<char> *)local_1479);
                                        std::__cxx11::string::~string(local_1450);
                                        std::allocator<char>::~allocator
                                                  ((allocator<char> *)&local_1451);
                                        std::
                                        vector<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                        ::~vector((
                                                  vector<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                                  *)in_stack_ffffffffffffe1e0);
                                        std::
                                        vector<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                        ::~vector((
                                                  vector<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                                  *)in_stack_ffffffffffffe1e0);
                                        std::__cxx11::string::~string(local_1400);
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    nlohmann::detail::
    iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::operator++(in_stack_ffffffffffffe1d0);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0xdd04b3);
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer((ScopedTimer *)in_stack_ffffffffffffe1d0);
  return;
}

Assistant:

void DataManSerializer::GetAttributes(core::IO &io)
{
    PERFSTUBS_SCOPED_TIMER_FUNC();
    std::lock_guard<std::mutex> lStaticDataJson(m_StaticDataJsonMutex);
    for (const auto &staticVar : m_StaticDataJson["S"])
    {
        const DataType type(helper::GetDataTypeFromString(staticVar["Y"].get<std::string>()));
        if (type == DataType::None)
        {
        }
#define declare_type(T)                                                                            \
    else if (type == helper::GetDataType<T>())                                                     \
    {                                                                                              \
        const auto &attributes = io.GetAttributes();                                               \
        auto it = attributes.find(staticVar["N"].get<std::string>());                              \
        if (it == attributes.end())                                                                \
        {                                                                                          \
            if (staticVar["V"].get<bool>())                                                        \
            {                                                                                      \
                io.DefineAttribute<T>(staticVar["N"].get<std::string>(), staticVar["G"].get<T>()); \
            }                                                                                      \
            else                                                                                   \
            {                                                                                      \
                io.DefineAttribute<T>(staticVar["N"].get<std::string>(),                           \
                                      staticVar["G"].get<std::vector<T>>().data(),                 \
                                      staticVar["G"].get<std::vector<T>>().size());                \
            }                                                                                      \
        }                                                                                          \
    }
        ADIOS2_FOREACH_ATTRIBUTE_STDTYPE_1ARG(declare_type)
#undef declare_type
    }
}